

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall google::protobuf::io::CodedInputStream::PopLimit(CodedInputStream *this,Limit limit)

{
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 0x28) = in_ESI;
  RecomputeBufferLimits((CodedInputStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined1 *)(in_RDI + 0x24) = 0;
  return;
}

Assistant:

void CodedInputStream::PopLimit(Limit limit) {
  // The limit passed in is actually the *old* limit, which we returned from
  // PushLimit().
  current_limit_ = limit;
  RecomputeBufferLimits();

  // We may no longer be at a legitimate message end.  ReadTag() needs to be
  // called again to find out.
  legitimate_message_end_ = false;
}